

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
asl::Array<asl::Map<asl::String,_asl::String>::KeyVal>::free
          (Array<asl::Map<asl::String,_asl::String>::KeyVal> *this,void *__ptr)

{
  long lVar1;
  long lVar2;
  KeyVal *pKVar3;
  
  pKVar3 = this->_a;
  lVar1 = (long)*(int *)&pKVar3[-1].value.field_2;
  if (lVar1 != 0) {
    lVar2 = 0;
    do {
      if (*(int *)((long)&(pKVar3->value)._size + lVar2) != 0) {
        ::free(*(void **)((long)&(pKVar3->value).field_2 + lVar2));
      }
      if (*(int *)((long)&(pKVar3->key)._size + lVar2) != 0) {
        ::free(*(void **)((long)&(pKVar3->key).field_2 + lVar2));
      }
      lVar2 = lVar2 + 0x30;
    } while (lVar1 * 0x30 != lVar2);
    pKVar3 = this->_a;
  }
  ::free(&pKVar3[-1].value.field_2);
  this->_a = (KeyVal *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}